

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

bool __thiscall TestClass::SyncRetFunc1(TestClass *this,uint64_t *p1)

{
  char cVar1;
  SyncRetEventAgent<bool> *this_00;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  cVar1 = EventDispatcher::isThreadCurrent();
  if (cVar1 != '\0') {
    *p1 = *p1 + 0x400;
    return true;
  }
  this_00 = (SyncRetEventAgent<bool> *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0xf8);
  *(undefined8 *)&this_00->field_0x8 = 0xfffffffb00000000;
  *(undefined4 *)&this_00->field_0x10 = 0;
  *(undefined ***)this_00 = &PTR_onRefCountZero_00110a68;
  *(TestClass **)(this_00 + 1) = this;
  *(code **)&this_00[1].field_0x8 = SyncRetFunc1;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(uint64_t **)(this_00 + 2) = p1;
  sVar2 = SyncRetEventAgent<bool>::send(this_00,(int)this + 8,__buf,0x10a57e,in_R8D);
  return SUB81(sVar2,0);
}

Assistant:

bool SyncRetFunc1(uint64_t &p1)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent1<TestClass, bool, uint64_t &>* agent =
				jh_new SyncRetEventAgent1<TestClass, bool, uint64_t &>(this, &TestClass::SyncRetFunc1,
					p1);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu)", result, p1);
			return result;
		}
		
		LOG_INFO("Received p1(%llu)", p1);
		p1+=1024;
		return true;
	}